

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidLoopBreak(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *pFVar2;
  Arena *pAVar3;
  FeatureType *pFVar4;
  ArrayFeatureType *this;
  NeuralNetwork *this_00;
  NeuralNetworkLayer *this_01;
  ArenaStringPtr *pAVar5;
  ostream *poVar6;
  undefined1 local_e8 [8];
  Result res;
  NeuralNetworkLayer *l2;
  NeuralNetworkLayer *l1;
  NeuralNetwork *nnMain;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"A",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  this = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  CoreML::Specification::ArrayFeatureType::add_shape(this,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  pFVar2 = CoreML::Specification::ModelDescription::add_output(pMVar1);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&pFVar2->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&pFVar2->name_,"B",pAVar3);
  pFVar4 = CoreML::Specification::FeatureDescription::mutable_type(pFVar2);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar4);
  this_00 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(this_00,EXACT_ARRAY_MAPPING);
  this_01 = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation(&this_01->super_MessageLite);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(&this_01->name_,"copy",pAVar3);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"B");
  CoreML::Specification::NeuralNetworkLayer::mutable_copy(this_01);
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetwork::add_layers(this_00);
  pAVar5 = &((NeuralNetworkLayer *)res.m_message.field_2._8_8_)->name_;
  pAVar3 = google::protobuf::MessageLite::GetArenaForAllocation
                     ((MessageLite *)res.m_message.field_2._8_8_);
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>(pAVar5,"break",pAVar3);
  CoreML::Specification::NeuralNetworkLayer::mutable_loopbreak
            ((NeuralNetworkLayer *)res.m_message.field_2._8_8_);
  CoreML::validate<(MLModelType)500>((Result *)local_e8,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_e8);
  if (m._oneof_case_[0]._0_1_) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x1285);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_e8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidLoopBreak() {
    /*
     loop break layer not inside a loop
     */
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();

    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *l1 = nnMain->add_layers();
    l1->set_name("copy");
    l1->add_input("A");
    l1->add_output("B");
    (void) l1->mutable_copy();

    auto *l2 = nnMain->add_layers();
    l2->set_name("break");
    (void) l2->mutable_loopbreak();

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}